

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawStringDecal
          (PixelGameEngine *this,vf2d *pos,string *sText,Pixel col,vf2d *scale)

{
  pointer pcVar1;
  size_type sVar2;
  uint uVar3;
  short sVar4;
  size_type sVar5;
  float fVar6;
  float fVar7;
  anon_union_4_2_12391da5_for_Pixel_0 local_4c;
  vf2d local_48;
  vf2d local_40;
  vf2d local_38;
  
  pcVar1 = (sText->_M_dataplus)._M_p;
  sVar2 = sText->_M_string_length;
  fVar6 = 0.0;
  fVar7 = 0.0;
  local_4c = col.field_0;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    sVar4 = (short)pcVar1[sVar5];
    if (sVar4 == 10) {
      fVar7 = fVar7 + scale->y * 8.0;
      fVar6 = 0.0;
    }
    else {
      sVar4 = sVar4 + -0x20;
      uVar3 = (int)sVar4 / 0x10;
      local_48.x = pos->x + fVar6;
      local_48.y = pos->y + fVar7;
      local_38.x = (float)(int)(short)(sVar4 + (short)uVar3 * -0x10) * 8.0;
      local_38.y = (float)(int)((long)((ulong)(uVar3 & 0xffff) << 0x30) >> 0x30) * 8.0;
      local_40.x = 8.0;
      local_40.y = 8.0;
      DrawPartialDecal(this,&local_48,this->fontDecal,&local_38,&local_40,scale,
                       (Pixel *)&local_4c.field_1);
      fVar6 = fVar6 + scale->x * 8.0;
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawStringDecal(const olc::vf2d &pos, const std::string &sText, const Pixel col, const olc::vf2d &scale)
	{
		olc::vf2d spos = {0.0f, 0.0f};
		for (auto c : sText)
		{
			if (c == '\n')
			{
				spos.x = 0;
				spos.y += 8.0f * scale.y;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;
				DrawPartialDecal(pos + spos, fontDecal, {float(ox) * 8.0f, float(oy) * 8.0f}, {8.0f, 8.0f}, scale, col);
				spos.x += 8.0f * scale.x;
			}
		}
	}